

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O2

void aom_comp_avg_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,int subpel_search)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  
  aom_upsampled_pred_sse2
            (xd,cm,mi_row,mi_col,mv,comp_pred,width,height,subpel_x_q3,subpel_y_q3,ref,ref_stride,
             subpel_search);
  uVar4 = height * width >> 4;
  uVar3 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  for (; (int)(uVar5 << 4) != (int)uVar3; uVar3 = uVar3 + 0x10) {
    puVar1 = comp_pred + uVar3;
    puVar2 = pred + uVar3;
    uVar6 = pavgb(*puVar2,*puVar1);
    uVar7 = pavgb(puVar2[1],puVar1[1]);
    uVar8 = pavgb(puVar2[2],puVar1[2]);
    uVar9 = pavgb(puVar2[3],puVar1[3]);
    uVar10 = pavgb(puVar2[4],puVar1[4]);
    uVar11 = pavgb(puVar2[5],puVar1[5]);
    uVar12 = pavgb(puVar2[6],puVar1[6]);
    uVar13 = pavgb(puVar2[7],puVar1[7]);
    uVar14 = pavgb(puVar2[8],puVar1[8]);
    uVar15 = pavgb(puVar2[9],puVar1[9]);
    uVar16 = pavgb(puVar2[10],puVar1[10]);
    uVar17 = pavgb(puVar2[0xb],puVar1[0xb]);
    uVar18 = pavgb(puVar2[0xc],puVar1[0xc]);
    uVar19 = pavgb(puVar2[0xd],puVar1[0xd]);
    uVar20 = pavgb(puVar2[0xe],puVar1[0xe]);
    uVar21 = pavgb(puVar2[0xf],puVar1[0xf]);
    puVar1 = comp_pred + uVar3;
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1[2] = uVar8;
    puVar1[3] = uVar9;
    puVar1[4] = uVar10;
    puVar1[5] = uVar11;
    puVar1[6] = uVar12;
    puVar1[7] = uVar13;
    puVar1[8] = uVar14;
    puVar1[9] = uVar15;
    puVar1[10] = uVar16;
    puVar1[0xb] = uVar17;
    puVar1[0xc] = uVar18;
    puVar1[0xd] = uVar19;
    puVar1[0xe] = uVar20;
    puVar1[0xf] = uVar21;
  }
  return;
}

Assistant:

void aom_comp_avg_upsampled_pred_sse2(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred, const uint8_t *pred, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref,
    int ref_stride, int subpel_search) {
  int n;
  int i;
  aom_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                     subpel_x_q3, subpel_y_q3, ref, ref_stride, subpel_search);
  /*The total number of pixels must be a multiple of 16 (e.g., 4x4).*/
  assert(!(width * height & 15));
  n = width * height >> 4;
  for (i = 0; i < n; i++) {
    __m128i s0 = xx_loadu_128(comp_pred);
    __m128i p0 = xx_loadu_128(pred);
    xx_storeu_128(comp_pred, _mm_avg_epu8(s0, p0));
    comp_pred += 16;
    pred += 16;
  }
}